

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O0

void __thiscall qpdf::pl::Count::Count(Count *this,unsigned_long id,Pipeline *next)

{
  Pipeline *next_local;
  unsigned_long id_local;
  Count *this_local;
  
  Pipeline::Pipeline(&this->super_Pipeline,"",next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Count_0058f178;
  this->count = 0;
  this->str = (string *)0x0;
  std::unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>>::
  unique_ptr<std::default_delete<qpdf::pl::Link>,void>
            ((unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>> *)&this->link,
             (nullptr_t)0x0);
  this->id_ = id;
  this->pass_immediately_to_next = next != (Pipeline *)0x0;
  return;
}

Assistant:

Count(unsigned long id, Pipeline* next = nullptr) :
            Pipeline("", next),
            id_(id),
            pass_immediately_to_next(next)
        {
        }